

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

void ngx_inet_set_port(sockaddr *sa,in_port_t port)

{
  uint16_t uVar1;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  in_port_t port_local;
  sockaddr *sa_local;
  
  if (sa->sa_family != 1) {
    if (sa->sa_family == 10) {
      uVar1 = htons(port);
      *(uint16_t *)sa->sa_data = uVar1;
    }
    else {
      uVar1 = htons(port);
      *(uint16_t *)sa->sa_data = uVar1;
    }
  }
  return;
}

Assistant:

void
ngx_inet_set_port(struct sockaddr *sa, in_port_t port)
{
    struct sockaddr_in   *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin6;
#endif

    switch (sa->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) sa;
        sin6->sin6_port = htons(port);
        break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:
        break;
#endif

    default: /* AF_INET */
        sin = (struct sockaddr_in *) sa;
        sin->sin_port = htons(port);
        break;
    }
}